

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  uint __line;
  pointer pfVar1;
  pointer pfVar2;
  char *__assertion;
  int64_t i;
  long i_00;
  real rVar3;
  
  pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (A->m_ == (long)pfVar2 - (long)pfVar1 >> 2) {
    if (A->n_ == (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) {
      for (i_00 = 0; i_00 < (long)pfVar2 - (long)pfVar1 >> 2; i_00 = i_00 + 1) {
        rVar3 = Matrix::dotRow(A,vec,i_00);
        pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar1[i_00] = rVar3;
        pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      return;
    }
    __assertion = "A.size(1) == vec.size()";
    __line = 0x58;
  }
  else {
    __assertion = "A.size(0) == size()";
    __line = 0x57;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                ,__line,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.size(0) == size());
  assert(A.size(1) == vec.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] = A.dotRow(vec, i);
  }
}